

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitStream.hpp
# Opt level: O0

unsigned_long __thiscall
rc::detail::BitStream<rc::Random>::next<unsigned_long>(BitStream<rc::Random> *this,undefined4 nbits)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  Number NVar4;
  unsigned_long uVar5;
  Random *in_stack_ffffffffffffffb0;
  unsigned_long bits;
  int n;
  int wantBits;
  unsigned_long value;
  BitStream<rc::Random> *pBStack_20;
  int nbits_local;
  BitStream<rc::Random> *this_local;
  ulong local_10;
  
  value._4_4_ = nbits;
  pBStack_20 = this;
  value._0_4_ = numBits<unsigned_long>();
  piVar3 = std::min<int>((int *)((long)&value + 4),(int *)&value);
  bits._4_4_ = *piVar3;
  if (bits._4_4_ == 0) {
    local_10 = 0;
  }
  else {
    _n = 0;
    value._4_4_ = bits._4_4_;
    for (; 0 < bits._4_4_; bits._4_4_ = bits._4_4_ - (int)bits) {
      if (this->m_numBits == 0) {
        NVar4 = Random::next(in_stack_ffffffffffffffb0);
        this->m_bits = NVar4;
        iVar2 = numBits<unsigned_long>();
        this->m_numBits = iVar2 + this->m_numBits;
      }
      piVar3 = std::min<int>(&this->m_numBits,(int *)((long)&bits + 4));
      bits._0_4_ = *piVar3;
      uVar1 = this->m_bits;
      uVar5 = bitMask<unsigned_long>((int)bits);
      _n = (uVar1 & uVar5) << ((char)value._4_4_ - (char)bits._4_4_ & 0x3fU) | _n;
      in_stack_ffffffffffffffb0 = (Random *)(long)(int)bits;
      iVar2 = numBits<unsigned_long>();
      if (in_stack_ffffffffffffffb0 < (Random *)(long)iVar2) {
        this->m_bits = this->m_bits >> ((byte)(int)bits & 0x3f);
      }
      this->m_numBits = this->m_numBits - (int)bits;
    }
    local_10 = _n;
  }
  return local_10;
}

Assistant:

T BitStream<Source>::next(int nbits, std::false_type) {
  using SourceType = decltype(m_source.next());
  nbits = std::min(nbits, numBits<T>());

  if (nbits == 0) {
    return 0;
  }

  T value = 0;
  int wantBits = nbits;
  while (wantBits > 0) {
    // Out of bits, refill
    if (m_numBits == 0) {
      m_bits = m_source.next();
      m_numBits += numBits<SourceType>();
    }

    const auto n = std::min(m_numBits, wantBits);
    const auto bits = m_bits & bitMask<SourceType>(n);
    value |= (bits << (nbits - wantBits));
    // To avoid right-shifting data beyond the width of the given type (which is
    // undefined behavior, because of course it is) only perform this shift-
    // assignment if we have room.
    if (static_cast<SourceType>(n) <
        static_cast<SourceType>(numBits<SourceType>())) {
      m_bits >>= static_cast<SourceType>(n);
    }
    m_numBits -= n;
    wantBits -= n;
  }

  if (std::is_signed<T>::value) {
    T signBit = static_cast<T>(0x1) << static_cast<T>(nbits - 1);
    if ((value & signBit) != 0) {
      // For signed values, we use the last bit as the sign bit. Since this
      // was 1, mask away by setting all bits above this one to 1 to make it a
      // negative number in 2's complement
      value |= ~bitMask<T>(nbits);
    }
  }

  return value;
}